

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildKey-C-API.cpp
# Opt level: O0

void llb_build_key_get_directory_tree_structure_signature_path
               (llb_build_key_t *key,llb_data_t *out_path)

{
  BuildKey *this;
  char *pcVar1;
  string local_50;
  undefined1 local_30 [8];
  StringRef path;
  llb_data_t *out_path_local;
  llb_build_key_t *key_local;
  
  path.Length = (size_t)out_path;
  this = anon_unknown.dwarf_1e10c2::CAPIBuildKey::getInternalBuildKey((CAPIBuildKey *)key);
  _local_30 = llbuild::buildsystem::BuildKey::getFilteredDirectoryPath(this);
  *(char **)path.Length = path.Data;
  llvm::StringRef::str_abi_cxx11_(&local_50,(StringRef *)local_30);
  pcVar1 = (char *)std::__cxx11::string::c_str();
  pcVar1 = strdup(pcVar1);
  *(char **)(path.Length + 8) = pcVar1;
  std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

void llb_build_key_get_directory_tree_structure_signature_path(llb_build_key_t *key, llb_data_t *out_path) {
  auto path = ((CAPIBuildKey *)key)->getInternalBuildKey().getFilteredDirectoryPath();
  out_path->length = path.size();
  out_path->data = (const uint8_t*)strdup(path.str().c_str());
}